

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::GenerateUi(cmQtAutoGenerators *this,string *realName,string *uiFileName)

{
  string *__lhs;
  bool bVar1;
  iterator iVar2;
  ostream *poVar3;
  bool bVar4;
  cmQtAutoGenerators *this_00;
  pointer pbVar5;
  int retVal;
  int sourceNewerThanUi;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string msg;
  string ui_output_file;
  string ui_input_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string path;
  
  __lhs = &this->Builddir;
  bVar1 = cmsys::SystemTools::FileExists((this->Builddir)._M_dataplus._M_p,false);
  if (!bVar1) {
    cmsys::SystemTools::MakeDirectory((__lhs->_M_dataplus)._M_p);
  }
  cmsys::SystemTools::GetFilenamePath(&ui_output_file,realName);
  std::operator+(&path,&ui_output_file,'/');
  std::__cxx11::string::~string((string *)&ui_output_file);
  std::operator+(&ui_input_file,"ui_",uiFileName);
  std::operator+(&ui_output_file,&ui_input_file,".h");
  std::__cxx11::string::~string((string *)&ui_input_file);
  std::operator+(&msg,&path,uiFileName);
  std::operator+(&ui_input_file,&msg,".ui");
  std::__cxx11::string::~string((string *)&msg);
  sourceNewerThanUi = 0;
  std::operator+(&msg,__lhs,&ui_output_file);
  bVar1 = cmsys::SystemTools::FileTimeCompare(&ui_input_file,&msg,&sourceNewerThanUi);
  std::__cxx11::string::~string((string *)&msg);
  if ((this->GenerateAll == false) && (bVar1 && sourceNewerThanUi < 0)) {
    bVar4 = false;
  }
  else {
    std::__cxx11::string::string((string *)&msg,"Generating ",(allocator *)&output);
    std::__cxx11::string::append((string *)&msg);
    cmSystemTools::MakefileColorEcho(0x105,msg._M_dataplus._M_p,true,this->ColorOutput);
    command.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    command.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    command.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&command,&this->UicExecutable);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&opts,&this->UicTargetOptions);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->UicOptions)._M_t,&ui_input_file);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->UicOptions)._M_t._M_impl.super__Rb_tree_header)
    {
      output._M_dataplus._M_p = (pointer)0x0;
      output._M_string_length = 0;
      output.field_2._M_allocated_capacity = 0;
      cmSystemTools::ExpandListArgument
                ((string *)(iVar2._M_node + 2),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&output,false);
      this_00 = this;
      std::operator==(&this->QtMajorVersion,"5");
      MergeUicOptions(this_00,&opts,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&output,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&output);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
               (const_iterator)
               command.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )opts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )opts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&output,"-o",(allocator *)&retVal);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,&output
              );
    std::__cxx11::string::~string((string *)&output);
    std::operator+(&output,__lhs,&ui_output_file);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,&output
              );
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&command,&ui_input_file);
    pbVar5 = command.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (this->Verbose == true) {
      for (; pbVar5 != command.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
        std::operator<<(poVar3," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_allocated_capacity = output.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    retVal = 0;
    bVar1 = cmSystemTools::RunSingleCommand
                      (&command,&output,&output,&retVal,(char *)0x0,OUTPUT_MERGE,0.0);
    bVar4 = bVar1 && retVal == 0;
    if (!bVar1 || retVal != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"AUTOUIC: error: process for ");
      poVar3 = std::operator<<(poVar3,(string *)&ui_output_file);
      poVar3 = std::operator<<(poVar3," needed by\n \"");
      poVar3 = std::operator<<(poVar3,(string *)realName);
      poVar3 = std::operator<<(poVar3,"\"\nfailed:\n");
      poVar3 = std::operator<<(poVar3,(string *)&output);
      std::endl<char,std::char_traits<char>>(poVar3);
      this->RunUicFailed = true;
      cmsys::SystemTools::RemoveFile(&ui_output_file);
    }
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&opts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&command);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__cxx11::string::~string((string *)&ui_input_file);
  std::__cxx11::string::~string((string *)&ui_output_file);
  std::__cxx11::string::~string((string *)&path);
  return bVar4;
}

Assistant:

bool cmQtAutoGenerators::GenerateUi(const std::string& realName,
                                    const std::string& uiFileName)
{
  if (!cmsys::SystemTools::FileExists(this->Builddir.c_str(), false))
    {
    cmsys::SystemTools::MakeDirectory(this->Builddir.c_str());
    }

  const std::string path = cmsys::SystemTools::GetFilenamePath(
                                                      realName) + '/';

  std::string ui_output_file = "ui_" + uiFileName + ".h";
  std::string ui_input_file = path + uiFileName + ".ui";

  int sourceNewerThanUi = 0;
  bool success = cmsys::SystemTools::FileTimeCompare(ui_input_file,
                                    this->Builddir + ui_output_file,
                                                     &sourceNewerThanUi);
  if (this->GenerateAll || !success || sourceNewerThanUi >= 0)
    {
    std::string msg = "Generating ";
    msg += ui_output_file;
    cmSystemTools::MakefileColorEcho(cmsysTerminal_Color_ForegroundBlue
                                          |cmsysTerminal_Color_ForegroundBold,
                                      msg.c_str(), true, this->ColorOutput);

    std::vector<std::string> command;
    command.push_back(this->UicExecutable);

    std::vector<std::string> opts = this->UicTargetOptions;
    std::map<std::string, std::string>::const_iterator optionIt
            = this->UicOptions.find(ui_input_file);
    if (optionIt != this->UicOptions.end())
      {
      std::vector<std::string> fileOpts;
      cmSystemTools::ExpandListArgument(optionIt->second, fileOpts);
      this->MergeUicOptions(opts, fileOpts, this->QtMajorVersion == "5");
      }
    command.insert(command.end(), opts.begin(), opts.end());

    command.push_back("-o");
    command.push_back(this->Builddir + ui_output_file);
    command.push_back(ui_input_file);

    if (this->Verbose)
      {
      for(std::vector<std::string>::const_iterator cmdIt = command.begin();
          cmdIt != command.end();
          ++cmdIt)
        {
        std::cout << *cmdIt << " ";
        }
      std::cout << std::endl;
      }
    std::string output;
    int retVal = 0;
    bool result = cmSystemTools::RunSingleCommand(command, &output, &output,
                                                  &retVal);
    if (!result || retVal)
      {
      std::cerr << "AUTOUIC: error: process for " << ui_output_file <<
                " needed by\n \"" << realName << "\"\nfailed:\n" << output
                << std::endl;
      this->RunUicFailed = true;
      cmSystemTools::RemoveFile(ui_output_file);
      return false;
      }
    return true;
    }
  return false;
}